

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCompression.cpp
# Opt level: O2

void anon_unknown.dwarf_8c8a1::writeRead
               (string *tempDir,pixelArray *array,int w,int h,int dx,int dy)

{
  int comp;
  Compression comp_00;
  int xs;
  int ys;
  string filename;
  
  std::operator+(&filename,tempDir,"imf_test_comp.exr");
  for (xs = 1; xs != 3; xs = xs + 1) {
    for (ys = 1; ys != 3; ys = ys + 1) {
      for (comp_00 = NO_COMPRESSION; comp_00 != NUM_COMPRESSION_METHODS;
          comp_00 = comp_00 + RLE_COMPRESSION) {
        writeRead(array,filename._M_dataplus._M_p,false,xs * 0x55b,ys * 0x9f,xs * 0x11,ys * 0x1d,
                  comp_00,xs,ys);
        if (ys == 1 && xs == 1) {
          writeRead(array,filename._M_dataplus._M_p,true,xs * 0x55b,ys * 0x9f,xs * 0x11,ys * 0x1d,
                    comp_00,1,1);
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&filename);
  return;
}

Assistant:

void
writeRead (
    const std::string& tempDir, pixelArray& array, int w, int h, int dx, int dy)
{
    std::string filename = tempDir + "imf_test_comp.exr";

    for (int xs = 1; xs <= 2; ++xs)
    {
        for (int ys = 1; ys <= 2; ++ys)
        {

            for (int comp = 0; comp < NUM_COMPRESSION_METHODS; ++comp)
            {
                writeRead (
                    array,
                    filename.c_str (),
                    false,
                    w * xs,
                    h * ys,
                    dx * xs,
                    dy * ys,
                    Compression (comp),
                    xs,
                    ys);

                if (xs == 1 && ys == 1)
                {
                    writeRead (
                        array,
                        filename.c_str (),
                        true,
                        w * xs,
                        h * ys,
                        dx * xs,
                        dy * ys,
                        Compression (comp),
                        xs,
                        ys);
                }
            }
        }
    }
}